

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

type * __thiscall
nonsugar::
parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>
          (type *__return_storage_ptr__,nonsugar *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,
          basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
          *command,argument_order order)

{
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>
  *flg;
  size_type *flg_00;
  ostream *poVar1;
  type *__n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined8 uVar3;
  undefined1 auVar4 [8];
  int iVar5;
  pointer psVar6;
  ostream *poVar7;
  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *long_name;
  element_type *peVar9;
  undefined8 uVar10;
  bool bVar11;
  bool exact;
  bool exclusive;
  const_iterator arg_it;
  string_type name;
  const_iterator arg_last;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partial_matches;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  subcommand_arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argument_args;
  iterator argument_it;
  iterator argument_last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  sstream<string_type> ss;
  undefined1 local_2c2 [10];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [40];
  undefined1 local_288 [16];
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  int local_25c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  pointer local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int *local_198;
  type *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  undefined1 *local_180;
  
  local_25c = (int)command;
  (__return_storage_ptr__->
  super_option_pair<char,__S_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__b_,_void>,_nonsugar::detail::option_pair<char,__c_,_void>,_nonsugar::detail::option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).value.
  super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__b_,_void>,_nonsugar::detail::option_pair<char,__c_,_void>,_nonsugar::detail::option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->
  super_option_pair<char,__S_,_nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__b_,_void>,_nonsugar::detail::option_pair<char,__c_,_void>,_nonsugar::detail::option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ).value.
  super___shared_ptr<nonsugar::option_map<char,_nonsugar::detail::option_pair<char,__b_,_void>,_nonsugar::detail::option_pair<char,__c_,_void>,_nonsugar::detail::option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)((long)&end._M_current[10].field_2 + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__a_,_void>).value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(end._M_current + 0xb));
  (__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)end._M_current[5].field_2._M_allocated_capacity;
  local_2c2._2_8_ = __return_storage_ptr__;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->super_option_pair<char,__b_,_void>).value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&end._M_current[5].field_2 + 8));
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d0,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )this,begin,(allocator_type *)local_1b8);
  local_2b8 = (undefined1  [8])
              local_1d0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b0._32_8_ =
       local_1d0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2c2[1] = '\0';
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = (type *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    flg = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>
           *)(end._M_current + 2);
    flg_00 = &end._M_current[7]._M_string_length;
    peVar9 = (element_type *)
             local_1d0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_1b8._0_8_ = local_1b8 + 0x10;
      local_2b8 = (undefined1  [8])peVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--","");
      __n = (type *)(peVar9->super_option_pair<char,__b_,_void>).value.
                    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (__n == (type *)local_1b8._8_8_) {
        if (__n == (type *)0x0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp((peVar9->super_option_pair<char,__b_,_void>).value.
                       super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (void *)local_1b8._0_8_,(size_t)__n);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      auVar4 = local_2b8;
      if (bVar11) break;
      local_278.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current = (char *)0x0;
      local_278.
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current = (char *)0x0;
      local_288._0_8_ = (pointer)0x0;
      local_288._8_8_ = (pointer)0x0;
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"--([^=]+)(?:=(.*))?","");
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,0x10
                );
      _Var2._M_current =
           (char *)(((option_pair<char,__b_,_void> *)auVar4)->value).
                   super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar11 = std::__detail::
               __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                         (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(_Var2._M_current +
                                  (long)&((((option_pair<char,__b_,_void> *)auVar4)->value).
                                          super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount._M_pi)->_vptr__Sp_counted_base),
                          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_288,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
      if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
        operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
      }
      auVar4 = local_2b8;
      if (bVar11) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str((string_type *)local_2b0,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_288,1);
        uVar3 = local_2c2._2_8_;
        local_2c2[0] = '\0';
        local_258._M_allocated_capacity = 0;
        local_258._8_8_ = (undefined8 *)0x0;
        local_248 = (pointer)0x0;
        local_1b8._8_8_ = local_2c2;
        local_1a8._8_8_ = &local_258;
        local_1b8._0_8_ = (string_type *)local_2b0;
        local_1a8._M_allocated_capacity = (size_type)end._M_current;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()
                  ((_lambda_auto_1_const___2_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>
                    *)flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#2}::operator()((_lambda_auto_1_const___2_ *)local_1b8,flg);
        if (local_2c2[0] == '\0') {
          if (local_258._M_allocated_capacity == local_258._8_8_) {
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            local_1f0._0_8_ = local_1f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f0,": unrecognized option: --","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210,end._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0);
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b8);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
          if (0x20 < (ulong)(local_258._8_8_ - local_258._0_8_)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar1 = (ostream *)(local_1b8 + 0x10);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar1,((end._M_current)->_M_dataplus)._M_p,
                                (end._M_current)->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ambiguous option: --",0x16)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_2b0._0_8_,local_2b0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
            uVar3 = local_258._8_8_;
            if (local_258._M_allocated_capacity != local_258._8_8_) {
              bVar11 = true;
              uVar10 = local_258._M_allocated_capacity;
              do {
                if (!bVar11) {
                  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--",2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,*(char **)uVar10,*(undefined8 *)(uVar10 + 8));
                uVar10 = uVar10 + 0x20;
                bVar11 = false;
              } while (uVar10 != uVar3);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
            pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_210);
            __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                        basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~basic_error);
          }
        }
        local_1b8._0_8_ = local_2c2;
        local_1b8._8_8_ = local_2b0;
        local_1a8._M_allocated_capacity = (size_type)local_288;
        local_1a8._8_8_ = local_2c2 + 10;
        local_198 = (int *)(local_2b0 + 0x20);
        local_190 = (type *)uVar3;
        local_180 = local_2c2 + 1;
        local_188 = end._M_current;
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()
                  ((_lambda_auto_1_const___3_ *)local_1b8,
                   (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>
                    *)flg_00);
        parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
        ::{lambda(auto:1_const&)#3}::operator()((_lambda_auto_1_const___3_ *)local_1b8,flg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_258);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
LAB_00127495:
        bVar11 = true;
      }
      else {
        local_2b0._0_8_ = local_2b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"-(.+)","");
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   0x10);
        _Var2._M_current =
             (char *)(((option_pair<char,__b_,_void> *)auVar4)->value).
                     super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar11 = std::__detail::
                 __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                           (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(_Var2._M_current +
                                    (long)&((((option_pair<char,__b_,_void> *)auVar4)->value).
                                            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                            _M_refcount._M_pi)->_vptr__Sp_counted_base),
                            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_288,
                            (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        uVar3 = local_2c2._2_8_;
        if (bVar11) {
          if (local_288._0_8_ == local_288._8_8_) {
            bVar11 = false;
          }
          else {
            bVar11 = ((long)(local_288._8_8_ - local_288._0_8_) >> 3) * -0x5555555555555555 - 5U <
                     0xfffffffffffffffe;
          }
          psVar6 = (pointer)(local_288._8_8_ + -0x48);
          if (bVar11) {
            psVar6 = (pointer)(local_288._0_8_ + 0x18);
          }
          local_1f0._0_8_ =
               (psVar6->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
          while( true ) {
            if (local_288._0_8_ == local_288._8_8_) {
              bVar11 = false;
            }
            else {
              bVar11 = ((long)(local_288._8_8_ - local_288._0_8_) >> 3) * -0x5555555555555555 - 5U <
                       0xfffffffffffffffe;
            }
            if (bVar11) {
              psVar6 = (pointer)(local_288._0_8_ + 0x18);
            }
            else {
              psVar6 = (pointer)(local_288._8_8_ + -0x48);
            }
            if ((pointer)local_1f0._0_8_ ==
                (pointer)(psVar6->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current) break;
            local_258._M_local_buf[0] = *(char *)&(((pointer)local_1f0._0_8_)->_M_dataplus)._M_p;
            local_2c2[0] = '\0';
            local_1b8._0_8_ = &local_258;
            local_1b8._8_8_ = local_2c2;
            local_1a8._M_allocated_capacity = (size_type)end._M_current;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()
                      ((_lambda_auto_1_const___4_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>
                        *)flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#4}::operator()((_lambda_auto_1_const___4_ *)local_1b8,flg);
            if (local_2c2[0] == '\0') {
              pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__cxa_allocate_exception(0x28);
              local_210._0_8_ = local_210 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_210,": unrecognized option: -","");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,end._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_210);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,local_258._M_local_buf[0]);
              basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b8);
              __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                          basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~basic_error);
            }
            local_1b8._0_8_ = &local_258;
            local_1b8._8_8_ = local_1f0;
            local_1a8._M_allocated_capacity = (size_type)local_288;
            local_1a8._8_8_ = local_2c2 + 10;
            local_198 = (int *)(local_2b0 + 0x20);
            local_190 = (type *)uVar3;
            local_180 = local_2c2 + 1;
            local_188 = end._M_current;
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()
                      ((_lambda_auto_1_const___5_ *)local_1b8,
                       (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__a_,_void>
                        *)flg_00);
            parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
            ::{lambda(auto:1_const&)#5}::operator()((_lambda_auto_1_const___5_ *)local_1b8,flg);
            local_1f0._0_8_ = local_1f0._0_8_ + 1;
          }
          goto LAB_00127495;
        }
        if ((regex_traits<char>)local_238._M_allocated_capacity == (regex_traits<char>)0x0) {
          local_1b8._0_8_ = (regex_traits<char>)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string_const&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1b8
                     ,(allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8)
          ;
          uVar10 = local_1b8._8_8_;
          local_238._M_allocated_capacity = local_1b8._0_8_;
          uVar3 = local_238._8_8_;
          local_1b8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1b8._8_8_ = (type *)0x0;
          local_238._8_8_ = uVar10;
          if ((type *)uVar3 != (type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
          if ((type *)local_1b8._8_8_ != (type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                     (option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)local_2b8 + 0x20),local_2b0._32_8_);
LAB_001277b7:
          bVar11 = false;
        }
        else {
          if (local_25c != 1) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_228,
                       local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_2b8,local_2b0._32_8_);
            goto LAB_001277b7;
          }
          bVar11 = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_228,(value_type *)local_2b8);
        }
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_,
                        (long)local_278.
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .first._M_current - local_288._0_8_);
      }
      if ((!bVar11) ||
         (peVar9 = (element_type *)((long)local_2b8 + 0x20), local_2b8 = (undefined1  [8])peVar9,
         peVar9 == (element_type *)local_2b0._32_8_)) goto LAB_001277de;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (option_pair<char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)local_2b8 + 0x20),local_2b0._32_8_);
  }
LAB_001277de:
  uVar3 = local_2c2._2_8_;
  if (local_2c2[1] == '\0') {
    local_210._0_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1f0._0_8_ =
         local_228.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((regex_traits<char>)local_238._M_allocated_capacity == (regex_traits<char>)0x0) {
      pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x28);
      local_288._0_8_ = local_288 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_288,": command required","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     end._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
      __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~basic_error);
    }
    local_1b8._8_8_ = &local_258;
    local_258._M_allocated_capacity = local_258._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._0_8_ = &local_238;
    local_1a8._M_allocated_capacity = (size_type)end._M_current;
    parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
    ::{lambda(auto:1_const&)#6}::operator()
              ((_lambda_auto_1_const___6_ *)local_1b8,
               (subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&end._M_current[0xc].field_2);
    if (local_258._M_local_buf[0] == '\0') {
      pbVar8 = (basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__cxa_allocate_exception(0x28);
      local_2b0._0_8_ = local_2b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b0,": unrecognized command: ","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     end._M_current,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_238._M_allocated_capacity);
      basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::basic_error(pbVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
      __cxa_throw(pbVar8,&basic_error<std::__cxx11::string>::typeinfo,
                  basic_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~basic_error);
    }
    local_1b8._8_8_ = uVar3;
    local_1a8._M_allocated_capacity = (size_type)local_210;
    local_1a8._8_8_ = local_1f0;
    local_198 = &local_25c;
    local_1b8._0_8_ = &local_238;
    parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)97,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,char,(char)83,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)98,void>,nonsugar::detail::flag<std::__cxx11::string,char,(char)99,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,char,(char)100,std::__cxx11::string>>>>>,std::tuple<>>const&,nonsugar::argument_order)
    ::{lambda(auto:1_const&)#7}::operator()
              ((_lambda_auto_1_const___7_ *)local_1b8,
               (subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__S_,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__c_,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&end._M_current[0xc].field_2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((type *)local_238._8_8_ != (type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  return (type *)uVar3;
}

Assistant:

inline typename detail::to_option_map<Command>::type parse(
    Iterator begin, Iterator end, Command const &command, argument_order order)
{
    using string_type = typename Command::string_type;
    using error_type = basic_error<string_type>;
    using regex_type = std::basic_regex<typename string_type::value_type>;
    auto const &_ = detail::widen<string_type>;

    typename detail::to_option_map<Command>::type opts;
    detail::tuple_for_each(command.m_flags, [&](auto const &flg)
        {
            constexpr auto option = detail::remove_cvr_t<decltype(flg)>::option();
            opts.template priv_value<option>() = flg.default_value;
        });

    std::vector<string_type> const args(begin, end);
    auto arg_it = args.begin();
    auto const arg_last = args.end();
    bool exclusive = false;

    constexpr auto subcommand_required =
        std::tuple_size<typename Command::subcommand_tuple_type>::value != 0;
    std::shared_ptr<string_type> subcommand_arg;
    std::vector<string_type> argument_args;

    for (; arg_it != arg_last; ++arg_it) {
        if (*arg_it == _("--")) {
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        }
        std::match_results<typename string_type::const_iterator> match;
        if (std::regex_match(*arg_it, match, regex_type(_("--([^=]+)(?:=(.*))?")))) {
            // long flag
            auto const name = match.str(1);
            bool exact = false;
            std::vector<string_type> partial_matches;
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    for (auto const &long_name : flg.long_names) {
                        if (name == long_name) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: --") + name);
                            }
                        } else if (detail::starts_with(long_name, name)) {
                            partial_matches.push_back(long_name);
                        }
                    }
                });
            if (!exact) {
                if (partial_matches.empty()) {
                    throw error_type(command.m_header + _(": unrecognized option: --") + name);
                } else if (partial_matches.size() >= 2) {
                    detail::sstream<string_type> ss;
                    ss << command.m_header << ": ambiguous option: --" << name << " [";
                    bool first = true;
                    for (auto const &long_name : partial_matches) {
                        if (!std::exchange(first, false)) ss << ", ";
                        ss << "--" << long_name;
                    }
                    ss << "]";
                    throw error_type(ss.str());
                }
            }
            detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                {
                    using flag_type = detail::remove_cvr_t<decltype(flg)>;
                    using value_type = typename flag_type::value_type;
                    constexpr auto option = flag_type::option();
                    for (auto const &long_name : flg.long_names) {
                        if (exact ? name == long_name : detail::starts_with(long_name, name)) {
                            string_type err;
                            detail::parse_flag_long<string_type, value_type>()(
                                match, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    }
                });
        } else if (std::regex_match(*arg_it, match, regex_type(_("-(.+)")))) {
            // short flag
            for (auto it = match[1].first; it != match[1].second; ++it) {
                auto const name = *it;
                bool exact = false;
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        if (detail::contains(flg.short_names, name)) {
                            if (std::exchange(exact, true)) {
                                throw error_type(
                                    command.m_header + _(": ambiguous option: -") + name);
                            }
                        }
                    });
                if (!exact) {
                    throw error_type(command.m_header + _(": unrecognized option: -") + name);
                }
                detail::tuple_for_each(command.m_flags, [&](auto const &flg)
                    {
                        using flag_type = detail::remove_cvr_t<decltype(flg)>;
                        using value_type = typename flag_type::value_type;
                        constexpr auto option = flag_type::option();
                        if (detail::contains(flg.short_names, name)) {
                            string_type err;
                            detail::parse_flag_short<string_type, value_type>()(
                                it, match[1].second, arg_it, arg_last,
                                opts.template priv_value<option>(), flg, err);
                            if (!err.empty()) {
                                throw error_type(command.m_header + _(": ") + err);
                            }
                            if (flg.exclusive) exclusive = true;
                        }
                    });
            }
        } else if (subcommand_required && !subcommand_arg) {
            // subcommand and arguments
            subcommand_arg = detail::copy_shared(*arg_it);
            argument_args.insert(argument_args.end(), std::next(arg_it), arg_last);
            break;
        } else if (order == argument_order::flexible) {
            // argument
            argument_args.push_back(*arg_it);
        } else {
            // arguments
            argument_args.insert(argument_args.end(), arg_it, arg_last);
            break;
        }
    }

    if (exclusive) return opts;

    auto argument_it = argument_args.begin();
    auto const argument_last = argument_args.end();

    if (subcommand_required) {
        if (!subcommand_arg) {
            throw error_type(command.m_header + _(": command required"));
        }
        bool exact = false;
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    if (std::exchange(exact, true)) {
                        throw error_type(
                            command.m_header + _(": ambiguous command: ") + *subcommand_arg);
                    }
                }
            });
        if (!exact) {
            throw error_type(command.m_header + _(": unrecognized command: ") + *subcommand_arg);
        }
        detail::tuple_for_each(command.m_subcommands, [&](auto const &subcmd)
            {
                if (subcmd.name == *subcommand_arg) {
                    using subcommand_type = std::remove_cv_t<
                        std::remove_reference_t<decltype(subcmd)>>;
                    constexpr auto option = subcommand_type::option();
                    opts.template priv_value<option>() = detail::copy_shared(
                        parse(argument_it, argument_last, subcmd.command, order));
                }
            });
        return opts;
    }

    detail::tuple_for_each(command.m_arguments, [&](auto const &arg)
        {
            using argument_type = std::remove_cv_t<std::remove_reference_t<decltype(arg)>>;
            using value_type = typename argument_type::value_type;
            constexpr auto option = argument_type::option();
            string_type err;
            detail::parse_argument<string_type, value_type>()(
                argument_it, argument_last, opts.template priv_value<option>(), arg, err);
            if (!err.empty()) {
                throw error_type(command.m_header + _(": ") + err);
            }
        });

    if (argument_it != argument_last) {
        throw error_type(command.m_header + _(": unrecognized argument: ") + *argument_it);
    }

    return opts;
}